

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O0

bool __thiscall ON_LocalZero1::FindZero(ON_LocalZero1 *this,double *t)

{
  bool bVar1;
  uint uVar2;
  double *t_local;
  ON_LocalZero1 *this_local;
  
  bVar1 = ON_IsValid(this->m_t0);
  if (bVar1) {
    bVar1 = ON_IsValid(this->m_t1);
    if (bVar1) {
      if (this->m_t1 < this->m_t0) {
        if (this->m_t0 <= this->m_t1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                     ,0x180,"","Illegal input - m_t0 and m_t1 are not valid.");
          return false;
        }
        this->m_s0 = this->m_t1;
        this->m_s1 = this->m_t0;
      }
      else {
        this->m_s0 = this->m_t0;
        this->m_s1 = this->m_t1;
      }
    }
    else {
      this->m_s1 = this->m_t0;
      this->m_s0 = this->m_t0;
    }
  }
  else {
    bVar1 = ON_IsValid(this->m_t1);
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                 ,0x16b,"","Illegal input - m_t0 and m_t1 are not valid.");
      return false;
    }
    this->m_s1 = this->m_t1;
    this->m_s0 = this->m_t1;
  }
  if ((this->m_s0 != this->m_s1) || (NAN(this->m_s0) || NAN(this->m_s1))) {
    uVar2 = (*this->_vptr_ON_LocalZero1[2])(this->m_s0,this,&this->m_f0,0,1);
    if ((uVar2 & 1) == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                 ,0x197,"","Evaluation failed at m_s0.");
      this_local._7_1_ = false;
    }
    else {
      uVar2 = (*this->_vptr_ON_LocalZero1[2])(this->m_s1,this,&this->m_f1,0,0xffffffff);
      if ((uVar2 & 1) == 0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                   ,0x19d,"","Evaluation failed at m_s1.");
        this_local._7_1_ = false;
      }
      else {
        bVar1 = BracketZero(this,this->m_s0,this->m_f0,this->m_s1,this->m_f1,0);
        if (bVar1) {
          if ((this->m_f_tolerance < ABS(this->m_f0)) || (ABS(this->m_f1) < ABS(this->m_f0))) {
            if (this->m_f_tolerance < ABS(this->m_f1)) {
              bVar1 = BracketSpan(this,this->m_s0,this->m_f0,this->m_s1,this->m_f1);
              if (bVar1) {
                bVar1 = NewtonRaphson(this,this->m_s0,this->m_f0,this->m_s1,this->m_f1,0x80,t);
                if (bVar1) {
                  this_local._7_1_ = true;
                }
                else {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                             ,0x1bd,"","Newton-Raphson failed to converge.  Is your function C2?");
                  this_local._7_1_ = false;
                }
              }
              else {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                           ,0x1b7,"",
                           "Unable to bracket the function in a span of m_k[].  m_k[] may be invalid."
                          );
                this_local._7_1_ = false;
              }
            }
            else {
              *t = this->m_s1;
              this_local._7_1_ = true;
            }
          }
          else {
            *t = this->m_s0;
            this_local._7_1_ = true;
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                     ,0x1a3,"","Unable to bracket a zero of the function.");
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    uVar2 = (*this->_vptr_ON_LocalZero1[2])(this->m_s0,this,&this->m_f0,0,1);
    if ((uVar2 & 1) == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                 ,0x191,"","Evaluation failed.");
      this_local._7_1_ = false;
    }
    else {
      this->m_f1 = this->m_f0;
      if (this->m_f_tolerance < ABS(this->m_f0)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                   ,0x18e,"",
                   "Illegal input - m_t0 = m_t1 and the function value is not zero at m_t0.");
        this_local._7_1_ = false;
      }
      else {
        *t = this->m_s0;
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_LocalZero1::FindZero( double* t )
{
  // Find values of m_s0 and m_s1 between m_t0 and m_t1 such that
  // f(m_t0) and f(m_t1) have different signs

  if ( !ON_IsValid(m_t0) )
  {
    if ( !ON_IsValid(m_t1) )
    {
      ON_ERROR("Illegal input - m_t0 and m_t1 are not valid.");
      return false;
    }
    m_s0 = m_s1 = m_t1;
  }
  else if ( !ON_IsValid(m_t1) )
  {
    m_s0 = m_s1 = m_t0;
  }
  else if ( m_t0 <= m_t1 )
  {
    m_s0 = m_t0;
    m_s1 = m_t1;
  }
  else if ( m_t1 < m_t0 )
  {
    m_s0 = m_t1;
    m_s1 = m_t0;
  }
  else
  {
    ON_ERROR("Illegal input - m_t0 and m_t1 are not valid.");
    return false;
  }

  if ( m_s0 == m_s1 )
  {
    if ( Evaluate( m_s0, &m_f0, nullptr, 1 ) ) 
    {
      m_f1 = m_f0;
      if ( fabs(m_f0) <= m_f_tolerance ) 
      {
        *t = m_s0;
        return true;
      }
      ON_ERROR("Illegal input - m_t0 = m_t1 and the function value is not zero at m_t0.");
      return false;
    }
    ON_ERROR("Evaluation failed.");
    return false;
  }

  if ( !Evaluate( m_s0, &m_f0, nullptr, 1 ) )
  {
    ON_ERROR("Evaluation failed at m_s0.");
    return false;
  }

  if ( !Evaluate( m_s1, &m_f1, nullptr, -1 ) )
  {
    ON_ERROR("Evaluation failed at m_s1.");
    return false;
  }

  if ( !BracketZero( m_s0, m_f0, m_s1, m_f1 ) )
  {
    ON_ERROR("Unable to bracket a zero of the function.");
    return false;
  }

  if ( fabs(m_f0) <= m_f_tolerance && fabs(m_f0) <= fabs(m_f1) )
  {
    // |f(s0)| <= user specified stopping tolerance
    *t = m_s0;
    return true;
  }
  
  if ( fabs(m_f1) <= m_f_tolerance ) 
  {
    // |f(s1)| <= user specified stopping tolerance
    *t = m_s1;
    return true;
  }

  if ( !BracketSpan( m_s0, m_f0, m_s1, m_f1 ) )
  {
    ON_ERROR("Unable to bracket the function in a span of m_k[].  m_k[] may be invalid.");
    return false;
  }

  if ( !NewtonRaphson( m_s0, m_f0, m_s1, m_f1, 128, t ) )
  {
    ON_ERROR("Newton-Raphson failed to converge.  Is your function C2?");
    return false;
  }

  return true;
}